

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O2

int SstFFSGetLocalDeferred
              (SstStream Stream,void *Variable,char *Name,size_t DimCount,int BlockID,size_t *Count,
              void *Data)

{
  void *pvVar1;
  FFSVarRec_conflict pFVar2;
  undefined8 *puVar3;
  void *__dest;
  size_t __size;
  
  pvVar1 = Stream->ReaderMarshalData;
  pFVar2 = LookupVarByKey(Stream,Variable);
  if (DimCount == 0) {
    memcpy(Data,(void *)(**(long **)((long)pvVar1 + 0x20) + *pFVar2->PerWriterMetaFieldOffset),
           (long)pFVar2->ElementSize);
  }
  else {
    puVar3 = (undefined8 *)calloc(1,0x38);
    *puVar3 = pFVar2;
    *(undefined4 *)(puVar3 + 1) = 1;
    puVar3[2] = (long)BlockID;
    CP_verbose(Stream,TraceVerbose,"Get request local, Name %s, BlockID %d, Count %zu\n",Name,
               (long)BlockID,*Count);
    __size = pFVar2->DimCount << 3;
    __dest = malloc(__size);
    puVar3[4] = __dest;
    memcpy(__dest,Count,__size);
    puVar3[5] = Data;
    puVar3[6] = *(undefined8 *)((long)pvVar1 + 0x18);
    *(undefined8 **)((long)pvVar1 + 0x18) = puVar3;
  }
  return (uint)(DimCount != 0);
}

Assistant:

extern int SstFFSGetLocalDeferred(SstStream Stream, void *Variable, const char *Name,
                                  size_t DimCount, const int BlockID, const size_t *Count,
                                  void *Data)
{
    struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;
    int GetFromWriter = 0;
    FFSVarRec Var = LookupVarByKey(Stream, Variable);

    // if Variable is in Metadata (I.E. DimCount == 0), move incoming data to
    // Data area
    if (DimCount == 0)
    {
        void *IncomingDataBase = ((char *)Info->MetadataBaseAddrs[GetFromWriter]) +
                                 Var->PerWriterMetaFieldOffset[GetFromWriter];
        memcpy(Data, IncomingDataBase, Var->ElementSize);
        return 0; // No Sync needed
    }
    else
    {
        // Build request structure and enter it into requests list
        FFSArrayRequest Req = malloc(sizeof(*Req));
        memset(Req, 0, sizeof(*Req));
        Req->VarRec = Var;
        Req->RequestType = Local;
        Req->BlockID = BlockID;
        // make a copy of Count request
        CP_verbose(Stream, TraceVerbose, "Get request local, Name %s, BlockID %d, Count %zu\n",
                   Name, BlockID, Count[0]);
        Req->Count = malloc(sizeof(Count[0]) * Var->DimCount);
        memcpy(Req->Count, Count, sizeof(Count[0]) * Var->DimCount);
        Req->Data = Data;
        Req->Next = Info->PendingVarRequests;
        Info->PendingVarRequests = Req;
        return 1; // Later Sync needed
    }
}